

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVProcessChain.cxx
# Opt level: O1

bool operator==(Status *actual,ExpectedStatus *expected)

{
  byte bVar1;
  
  bVar1 = expected->Finished ^ 1;
  if (actual == (Status *)0x0 || bVar1 != 0) {
    return (bool)(actual == (Status *)0x0 & bVar1);
  }
  if (((expected->MatchExitStatus != true) || ((expected->Status).ExitStatus == actual->ExitStatus))
     && ((expected->MatchTermSignal != true || ((expected->Status).TermSignal == actual->TermSignal)
         ))) {
    return true;
  }
  return false;
}

Assistant:

bool operator==(const cmUVProcessChain::Status* actual,
                const ExpectedStatus& expected)
{
  if (!expected.Finished) {
    return !actual;
  } else if (!actual) {
    return false;
  }
  if (expected.MatchExitStatus &&
      expected.Status.ExitStatus != actual->ExitStatus) {
    return false;
  }
  if (expected.MatchTermSignal &&
      expected.Status.TermSignal != actual->TermSignal) {
    return false;
  }
  return true;
}